

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O0

uint TrimFlags(uint flags)

{
  long lVar1;
  uint in_EDI;
  long in_FS_OFFSET;
  undefined4 in_stack_0000000c;
  char *in_stack_00000010;
  int in_stack_0000001c;
  char *in_stack_00000020;
  bool *in_stack_00000028;
  uint in_stack_ffffffffffffffe8;
  undefined4 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_EDI;
  if ((in_EDI & 1) == 0) {
    local_10 = in_EDI & 0xfffff7ff;
  }
  if ((local_10 & 0x800) == 0) {
    local_10 = local_10 & 0xfffffeff;
  }
  IsValidFlagCombination(in_stack_ffffffffffffffe8);
  inline_assertion_check<true,bool>
            (in_stack_00000028,in_stack_00000020,in_stack_0000001c,in_stack_00000010,
             (char *)CONCAT44(in_stack_0000000c,flags));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

unsigned int TrimFlags(unsigned int flags)
{
    // WITNESS requires P2SH
    if (!(flags & SCRIPT_VERIFY_P2SH)) flags &= ~(unsigned int)SCRIPT_VERIFY_WITNESS;

    // CLEANSTACK requires WITNESS (and transitively CLEANSTACK requires P2SH)
    if (!(flags & SCRIPT_VERIFY_WITNESS)) flags &= ~(unsigned int)SCRIPT_VERIFY_CLEANSTACK;
    Assert(IsValidFlagCombination(flags));
    return flags;
}